

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O1

uint Ivy_Hash(Ivy_Obj_t *pObj,int TableSize)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  pIVar1 = pObj->pFanin0;
  uVar4 = 0;
  uVar3 = 0;
  if (pIVar1 != (Ivy_Obj_t *)0x0) {
    uVar3 = *(int *)((ulong)pIVar1 & 0xfffffffffffffffe) * 0x1f01;
  }
  pIVar2 = pObj->pFanin1;
  if (pIVar2 != (Ivy_Obj_t *)0x0) {
    uVar4 = *(int *)((ulong)pIVar2 & 0xfffffffffffffffe) * 0xb9b;
  }
  uVar7 = 0x6a3;
  if ((*(uint *)&pObj->field_0x8 & 0xf) != 6) {
    uVar7 = 0;
  }
  uVar5 = 0x38f;
  if (((ulong)pIVar1 & 1) == 0) {
    uVar5 = 0;
  }
  uVar6 = 0x161;
  if (((ulong)pIVar2 & 1) == 0) {
    uVar6 = 0;
  }
  return (uVar3 ^ uVar6 ^ uVar4 ^ uVar5 ^ uVar7 ^ (*(uint *)&pObj->field_0x8 >> 9 & 3) * 0x38f) %
         (uint)TableSize;
}

Assistant:

static inline int          Ivy_ObjFaninId0( Ivy_Obj_t * pObj )    { return pObj->pFanin0? Ivy_ObjId(Ivy_Regular(pObj->pFanin0)) : 0; }